

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_set_loss(ggml_tensor *tensor)

{
  _Bool _Var1;
  char *pcVar2;
  int line;
  
  _Var1 = ggml_is_scalar(tensor);
  if (_Var1) {
    if (tensor->type == GGML_TYPE_F32) {
      *(byte *)&tensor->flags = (byte)tensor->flags | 8;
      return;
    }
    pcVar2 = "tensor->type == GGML_TYPE_F32";
    line = 0x18f8;
  }
  else {
    pcVar2 = "ggml_is_scalar(tensor)";
    line = 0x18f7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

void ggml_set_loss(struct ggml_tensor * tensor) {
    GGML_ASSERT(ggml_is_scalar(tensor));
    GGML_ASSERT(tensor->type == GGML_TYPE_F32);
    tensor->flags |= GGML_TENSOR_FLAG_LOSS;
}